

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

bool amrex::AmrLevel::isStateVariable(string *name,int *typ,int *n)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  StateDescriptor *this;
  string *psVar3;
  bool bVar4;
  int iVar5;
  
  *typ = 0;
  iVar2 = DescriptorList::size((DescriptorList *)desc_lst);
  bVar4 = 0 < iVar2;
  if (0 < iVar2) {
    do {
      this = DescriptorList::operator[]((DescriptorList *)desc_lst,*typ);
      *n = 0;
      iVar2 = StateDescriptor::nComp(this);
      bVar1 = 0 < iVar2;
      if (0 < iVar2) {
        do {
          psVar3 = StateDescriptor::name_abi_cxx11_(this,*n);
          __n = psVar3->_M_string_length;
          if ((__n == name->_M_string_length) &&
             ((__n == 0 ||
              (iVar2 = bcmp((psVar3->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar2 == 0))))
          {
            if (bVar1) {
              return bVar4;
            }
            break;
          }
          iVar5 = *n + 1;
          *n = iVar5;
          iVar2 = StateDescriptor::nComp(this);
          bVar1 = iVar5 < iVar2;
        } while (iVar5 < iVar2);
      }
      iVar5 = *typ + 1;
      *typ = iVar5;
      iVar2 = DescriptorList::size((DescriptorList *)desc_lst);
      bVar4 = iVar5 < iVar2;
    } while (iVar5 < iVar2);
  }
  return bVar4;
}

Assistant:

bool
AmrLevel::isStateVariable (const std::string& name, int& typ, int& n)
{
    for (typ = 0; typ < desc_lst.size(); typ++)
    {
        const StateDescriptor& desc = desc_lst[typ];

        for (n = 0; n < desc.nComp(); n++)
        {
            if (desc.name(n) == name)
                return true;
        }
    }
    return false;
}